

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# istream.cc
# Opt level: O3

uint __thiscall wabt::interp::Istream::ReadAt<unsigned_int>(Istream *this,Offset *offset)

{
  uint uVar1;
  uint uVar2;
  pointer puVar3;
  
  uVar1 = *offset;
  puVar3 = (this->data_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((ulong)uVar1 + 4 <=
      (ulong)((long)(this->data_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_finish - (long)puVar3)) {
    uVar2 = *(uint *)(puVar3 + uVar1);
    *offset = uVar1 + 4;
    return uVar2;
  }
  __assert_fail("*offset + sizeof(T) <= data_.size()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/interp/istream.cc"
                ,0x62,"T wabt::interp::Istream::ReadAt(Offset *) const [T = unsigned int]");
}

Assistant:

T WABT_VECTORCALL Istream::ReadAt(Offset* offset) const {
  assert(*offset + sizeof(T) <= data_.size());
  T result;
  memcpy(&result, data_.data() + *offset, sizeof(T));
  *offset += sizeof(T);
  return result;
}